

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O2

bool __thiscall
sentencepiece::unigram::Model::VerifyOutputsEquivalent
          (Model *this,string_view expected,string_view actual)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined1 in_R9B;
  float fVar4;
  float fVar5;
  string_view str;
  string_view str_00;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_88;
  anon_class_8_1_8991fb9c compute_unigram_model_score;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_58;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_40;
  
  str._M_len = expected._M_str;
  str._M_str = (char *)0x20;
  compute_unigram_model_score.this = this;
  absl::StrSplit((Splitter *)&local_88,(absl *)expected._M_len,str,'\0',(bool)in_R9B);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&local_40,
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&local_88);
  fVar4 = VerifyOutputsEquivalent::anon_class_8_1_8991fb9c::operator()
                    (&compute_unigram_model_score,
                     (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_40);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_40);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_88);
  str_00._M_str = (char *)0x20;
  str_00._M_len = (size_t)actual._M_str;
  absl::StrSplit((Splitter *)&local_88,(absl *)actual._M_len,str_00,'\0',(bool)in_R9B);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&local_58,
           (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)&local_88);
  fVar5 = VerifyOutputsEquivalent::anon_class_8_1_8991fb9c::operator()
                    (&compute_unigram_model_score,
                     (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_58);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_58);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_88);
  if (1e-07 < ABS(fVar4 - fVar5)) {
    iVar1 = logging::GetMinLogLevel();
    if (iVar1 < 2) {
      local_88._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
      pcVar2 = logging::BaseName("third_party/sentencepiece/src/unigram_model.cc");
      poVar3 = std::operator<<((ostream *)&std::cerr,pcVar2);
      poVar3 = std::operator<<(poVar3,"(");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x371);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"LOG(");
      poVar3 = std::operator<<(poVar3,"WARNING");
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,"Two sentence piece sequences are not equivalent! Left: ");
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,str._M_len,(long)expected._M_len);
      poVar3 = std::operator<<(poVar3,", Score: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar4);
      poVar3 = std::operator<<(poVar3,". Right: ");
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,actual._M_str,(long)actual._M_len);
      poVar3 = std::operator<<(poVar3,", Score: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar5);
      std::operator<<(poVar3,".");
      error::Die::~Die((Die *)&local_88);
    }
  }
  return ABS(fVar4 - fVar5) <= 1e-07;
}

Assistant:

bool Model::VerifyOutputsEquivalent(absl::string_view expected,
                                    absl::string_view actual) const {
  auto compute_unigram_model_score =
      [this](std::vector<absl::string_view> output_pieces) {
        float total_score = 0;
        const float unk_score = min_score() - kUnkPenalty;
        for (const auto p : output_pieces) {
          const auto id = PieceToId(p);
          if (id == unk_id_) {
            total_score += unk_score;
          } else {
            const int length = p.size();
            total_score += IsUserDefinedInlined(id)
                               ? (length * max_score_ - 0.1)
                               : GetScoreInlined(id);
          }
        }
        return total_score;
      };
  const auto expected_score =
      compute_unigram_model_score(absl::StrSplit(expected, ' '));
  const auto actual_score =
      compute_unigram_model_score(absl::StrSplit(actual, ' '));
  if (std::abs(expected_score - actual_score) > kEpsilon) {
    LOG(WARNING) << "Two sentence piece sequences are not equivalent! Left: "
                 << expected << ", Score: " << expected_score
                 << ". Right: " << actual << ", Score: " << actual_score << ".";
    return false;
  }
  return true;
}